

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_extract.cpp
# Opt level: O2

void duckdb::ListExtractFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  LogicalTypeId LVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  anon_union_16_2_67f50693_for_value *paVar5;
  unsigned_long uVar6;
  data_ptr_t pdVar7;
  idx_t *piVar8;
  pointer puVar9;
  SelectionVector *pSVar10;
  reference vector;
  reference vector_00;
  Vector *this;
  idx_t iVar11;
  idx_t iVar12;
  ulong uVar13;
  NotImplementedException *this_00;
  ulong uVar14;
  idx_t iVar15;
  unsigned_long *invalid_idx;
  pointer puVar16;
  idx_t *piVar17;
  long lVar18;
  data_ptr_t pdVar19;
  data_ptr_t pdVar20;
  ulong uVar21;
  int64_t in_R9;
  ulong uVar22;
  ulong uVar23;
  idx_t count;
  ulong uVar24;
  ulong uVar25;
  data_ptr_t pdVar26;
  bool bVar27;
  anon_struct_16_3_d7536bce_for_pointer aVar28;
  string_t sVar29;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  idx_t local_190;
  ulong local_158;
  optional_idx child_offset;
  optional_idx first_valid_child_idx;
  optional_idx local_140;
  vector<unsigned_long,_true> invalid_offsets;
  SelectionVector sel;
  UnifiedVectorFormat list_data;
  UnifiedVectorFormat offsets_data;
  UnifiedVectorFormat child_data;
  
  count = args->count;
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  LVar1 = (vector->type).id_;
  if (LVar1 != SQLNULL) {
    if (LVar1 != VARCHAR) {
      if (LVar1 != LIST) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&list_data,"Specifier type not implemented",(allocator *)&offsets_data)
        ;
        NotImplementedException::NotImplementedException(this_00,(string *)&list_data);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&list_data);
      UnifiedVectorFormat::UnifiedVectorFormat(&offsets_data);
      Vector::ToUnifiedFormat(vector,count,&list_data);
      Vector::ToUnifiedFormat(vector_00,count,&offsets_data);
      UnifiedVectorFormat::UnifiedVectorFormat(&child_data);
      this = ListVector::GetEntry(vector);
      iVar11 = ListVector::GetListSize(vector);
      Vector::ToUnifiedFormat(this,iVar11,&child_data);
      SelectionVector::SelectionVector(&sel,count);
      invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      first_valid_child_idx.index = 0xffffffffffffffff;
      local_190 = 0xffffffffffffffff;
      for (local_158 = 0;
          puVar9 = invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish, local_158 < count; local_158 = local_158 + 1)
      {
        uVar23 = local_158;
        if ((list_data.sel)->sel_vector != (sel_t *)0x0) {
          uVar23 = (ulong)(list_data.sel)->sel_vector[local_158];
        }
        uVar14 = local_158;
        if ((offsets_data.sel)->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)(offsets_data.sel)->sel_vector[local_158];
        }
        if (((list_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((list_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0)) &&
           ((offsets_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0 ||
            ((offsets_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)))) {
          lVar18 = *(long *)(offsets_data.data + uVar14 * 8);
          if (lVar18 == 0) {
LAB_0148f3eb:
            child_offset.index = 0xffffffffffffffff;
          }
          else {
            uVar21 = lVar18 - (ulong)(0 < lVar18);
            uVar14 = *(ulong *)((long)(list_data.data + uVar23 * 0x10) + 8);
            if ((long)uVar21 < 0) {
              uVar21 = uVar21 + uVar14;
              if ((long)uVar21 < 0) goto LAB_0148f3eb;
            }
            else if (uVar14 <= uVar21) goto LAB_0148f3eb;
            optional_idx::optional_idx
                      (&local_140,uVar21 + *(long *)(list_data.data + uVar23 * 0x10));
            pSVar10 = child_data.sel;
            child_offset.index = local_140.index;
            if (local_140.index != 0xffffffffffffffff) {
              iVar11 = optional_idx::GetIndex(&child_offset);
              if (pSVar10->sel_vector != (sel_t *)0x0) {
                iVar11 = (idx_t)pSVar10->sel_vector[iVar11];
              }
              sel.sel_vector[local_158] = (sel_t)iVar11;
              if (local_190 == 0xffffffffffffffff) {
                optional_idx::optional_idx(&local_140,iVar11);
                local_190 = local_140.index;
                first_valid_child_idx.index = local_190;
              }
              goto LAB_0148f409;
            }
          }
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                     &local_158);
        }
        else {
          ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                     &local_158);
        }
LAB_0148f409:
      }
      piVar17 = invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar8 = invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_190 != 0xffffffffffffffff) {
        for (puVar16 = invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar16 != puVar9; puVar16 = puVar16 + 1) {
          uVar6 = *puVar16;
          iVar11 = optional_idx::GetIndex(&first_valid_child_idx);
          sel.sel_vector[uVar6] = (sel_t)iVar11;
        }
        VectorOperations::Copy(this,result,&sel,count,0,0);
        piVar17 = invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar8 = invalid_offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      for (; piVar17 != piVar8; piVar17 = piVar17 + 1) {
        FlatVector::SetNull(result,*piVar17,true);
      }
      if ((count == 1) ||
         ((vector->vector_type == CONSTANT_VECTOR && (vector_00->vector_type == CONSTANT_VECTOR))))
      {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      Vector::Verify(result,count);
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&invalid_offsets);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&child_data);
LAB_0148f78a:
      UnifiedVectorFormat::~UnifiedVectorFormat(&offsets_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&list_data);
      return;
    }
    VVar2 = vector->vector_type;
    VVar3 = vector_00->vector_type;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      paVar5 = (anon_union_16_2_67f50693_for_value *)result->data;
      if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
         ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
          puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
        sVar29.value.pointer.ptr = (char *)*(undefined8 *)vector_00->data;
        sVar29.value._0_8_ = *(undefined8 *)(vector->data + 8);
        aVar28 = (anon_struct_16_3_d7536bce_for_pointer)
                 SubstringUnicode((duckdb *)result,*(Vector **)vector->data,sVar29,1,in_R9);
        paVar5->pointer = aVar28;
        return;
      }
      goto LAB_0148f7e8;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar20 = vector->data;
      pdVar7 = vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar19 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,&vector->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          lVar18 = 8;
          while (bVar27 = count != 0, count = count - 1, bVar27) {
            input_04.value.pointer.ptr = (char *)*(undefined8 *)pdVar7;
            input_04.value._0_8_ = *(undefined8 *)(pdVar20 + lVar18);
            sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar20 + lVar18 + -8),input_04,
                                      1,in_R9);
            *(long *)(pdVar19 + lVar18 + -8) = sVar29.value._0_8_;
            *(long *)(pdVar19 + lVar18) = sVar29.value._8_8_;
            lVar18 = lVar18 + 0x10;
          }
          return;
        }
        uVar14 = 0;
        uVar23 = 0;
        do {
          if (uVar14 == count + 0x3f >> 6) {
            return;
          }
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar21 = uVar23 + 0x40;
            if (count <= uVar23 + 0x40) {
              uVar21 = count;
            }
LAB_0148f65c:
            uVar24 = uVar23 << 4 | 8;
            for (; uVar13 = uVar23, uVar23 < uVar21; uVar23 = uVar23 + 1) {
              input.value.pointer.ptr = (char *)*(undefined8 *)pdVar7;
              input.value._0_8_ = *(undefined8 *)(pdVar20 + uVar24);
              sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar20 + (uVar24 - 8)),input,
                                        1,in_R9);
              *(long *)(pdVar19 + (uVar24 - 8)) = sVar29.value._0_8_;
              *(long *)(pdVar19 + uVar24) = sVar29.value._8_8_;
              uVar24 = uVar24 + 0x10;
            }
          }
          else {
            uVar24 = puVar4[uVar14];
            uVar21 = uVar23 + 0x40;
            if (count <= uVar23 + 0x40) {
              uVar21 = count;
            }
            if (uVar24 == 0xffffffffffffffff) goto LAB_0148f65c;
            uVar13 = uVar21;
            if (uVar24 != 0) {
              uVar22 = uVar23 << 4 | 8;
              for (uVar25 = 0; uVar13 = uVar23 + uVar25, uVar23 + uVar25 < uVar21;
                  uVar25 = uVar25 + 1) {
                if ((uVar24 >> (uVar25 & 0x3f) & 1) != 0) {
                  input_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar7;
                  input_00.value._0_8_ = *(undefined8 *)(pdVar20 + uVar22);
                  sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar20 + (uVar22 - 8)),
                                            input_00,1,in_R9);
                  *(long *)(pdVar19 + (uVar22 - 8)) = sVar29.value._0_8_;
                  *(long *)(pdVar19 + uVar22) = sVar29.value._8_8_;
                }
                uVar22 = uVar22 + 0x10;
              }
            }
          }
          uVar14 = uVar14 + 1;
          uVar23 = uVar13;
        } while( true );
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar20 = vector->data;
          pdVar7 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar19 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,&vector->validity);
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            lVar18 = 0;
            while (bVar27 = count != 0, count = count - 1, bVar27) {
              input_09.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + lVar18);
              input_09.value._0_8_ = *(undefined8 *)(pdVar20 + lVar18 * 2 + 8);
              sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar20 + lVar18 * 2),input_09
                                        ,1,in_R9);
              *(long *)(pdVar19 + lVar18 * 2) = sVar29.value._0_8_;
              *(long *)(pdVar19 + lVar18 * 2 + 8) = sVar29.value._8_8_;
              lVar18 = lVar18 + 8;
            }
            return;
          }
          uVar14 = 0;
          uVar23 = 0;
          do {
            if (uVar14 == count + 0x3f >> 6) {
              return;
            }
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar21 = uVar23 + 0x40;
              if (count <= uVar23 + 0x40) {
                uVar21 = count;
              }
LAB_0148fb9a:
              uVar24 = uVar23 << 4 | 8;
              for (; uVar13 = uVar23, uVar23 < uVar21; uVar23 = uVar23 + 1) {
                input_05.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + uVar23 * 8);
                input_05.value._0_8_ = *(undefined8 *)(pdVar20 + uVar24);
                sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar20 + (uVar24 - 8)),
                                          input_05,1,in_R9);
                *(long *)(pdVar19 + (uVar24 - 8)) = sVar29.value._0_8_;
                *(long *)(pdVar19 + uVar24) = sVar29.value._8_8_;
                uVar24 = uVar24 + 0x10;
              }
            }
            else {
              uVar24 = puVar4[uVar14];
              uVar21 = uVar23 + 0x40;
              if (count <= uVar23 + 0x40) {
                uVar21 = count;
              }
              if (uVar24 == 0xffffffffffffffff) goto LAB_0148fb9a;
              uVar13 = uVar21;
              if (uVar24 != 0) {
                uVar25 = uVar23 << 4 | 8;
                for (uVar22 = 0; uVar13 = uVar23 + uVar22, uVar23 + uVar22 < uVar21;
                    uVar22 = uVar22 + 1) {
                  if ((uVar24 >> (uVar22 & 0x3f) & 1) != 0) {
                    input_06.value.pointer.ptr =
                         (char *)*(undefined8 *)(pdVar7 + uVar22 * 8 + uVar23 * 8);
                    input_06.value._0_8_ = *(undefined8 *)(pdVar20 + uVar25);
                    sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar20 + (uVar25 - 8)),
                                              input_06,1,in_R9);
                    *(long *)(pdVar19 + (uVar25 - 8)) = sVar29.value._0_8_;
                    *(long *)(pdVar19 + uVar25) = sVar29.value._8_8_;
                  }
                  uVar25 = uVar25 + 0x10;
                }
              }
            }
            uVar14 = uVar14 + 1;
            uVar23 = uVar13;
          } while( true );
        }
        UnifiedVectorFormat::UnifiedVectorFormat(&list_data);
        UnifiedVectorFormat::UnifiedVectorFormat(&offsets_data);
        Vector::ToUnifiedFormat(vector,count,&list_data);
        Vector::ToUnifiedFormat(vector_00,count,&offsets_data);
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar20 = result->data;
        FlatVector::VerifyFlatVector(result);
        if (offsets_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 &&
            list_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar20 = pdVar20 + 8;
          for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
            iVar12 = iVar11;
            if ((list_data.sel)->sel_vector != (sel_t *)0x0) {
              iVar12 = (idx_t)(list_data.sel)->sel_vector[iVar11];
            }
            iVar15 = iVar11;
            if ((offsets_data.sel)->sel_vector != (sel_t *)0x0) {
              iVar15 = (idx_t)(offsets_data.sel)->sel_vector[iVar11];
            }
            input_01.value.pointer.ptr = (char *)*(undefined8 *)(offsets_data.data + iVar15 * 8);
            input_01.value._0_8_ = *(undefined8 *)(list_data.data + iVar12 * 0x10 + 8);
            sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)(list_data.data + iVar12 * 0x10),
                                      input_01,1,in_R9);
            *(long *)(pdVar20 + -8) = sVar29.value._0_8_;
            *(long *)pdVar20 = sVar29.value._8_8_;
            pdVar20 = pdVar20 + 0x10;
          }
        }
        else {
          pdVar20 = pdVar20 + 8;
          for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
            iVar12 = iVar11;
            if ((list_data.sel)->sel_vector != (sel_t *)0x0) {
              iVar12 = (idx_t)(list_data.sel)->sel_vector[iVar11];
            }
            iVar15 = iVar11;
            if ((offsets_data.sel)->sel_vector != (sel_t *)0x0) {
              iVar15 = (idx_t)(offsets_data.sel)->sel_vector[iVar11];
            }
            if (((list_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) ||
                ((list_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar12 >> 6] >> (iVar12 & 0x3f) & 1) != 0)) &&
               ((offsets_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0 ||
                ((offsets_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar15 >> 6] >> (iVar15 & 0x3f) & 1) != 0)))) {
              input_07.value.pointer.ptr = (char *)*(undefined8 *)(offsets_data.data + iVar15 * 8);
              input_07.value._0_8_ = *(undefined8 *)(list_data.data + iVar12 * 0x10 + 8);
              sVar29 = SubstringUnicode((duckdb *)result,
                                        *(Vector **)(list_data.data + iVar12 * 0x10),input_07,1,
                                        in_R9);
              *(long *)(pdVar20 + -8) = sVar29.value._0_8_;
              *(long *)pdVar20 = sVar29.value._8_8_;
            }
            else {
              TemplatedValidityMask<unsigned_long>::SetInvalid
                        (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar11);
            }
            pdVar20 = pdVar20 + 0x10;
          }
        }
        goto LAB_0148f78a;
      }
      pdVar20 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar7 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar19 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,&vector_00->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          pdVar19 = pdVar19 + 8;
          for (iVar11 = 0; count != iVar11; iVar11 = iVar11 + 1) {
            input_08.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + iVar11 * 8);
            input_08.value._0_8_ = *(undefined8 *)(pdVar20 + 8);
            sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar20,input_08,1,in_R9);
            *(long *)(pdVar19 + -8) = sVar29.value._0_8_;
            *(long *)pdVar19 = sVar29.value._8_8_;
            pdVar19 = pdVar19 + 0x10;
          }
          return;
        }
        uVar14 = 0;
        uVar23 = 0;
        do {
          if (uVar14 == count + 0x3f >> 6) {
            return;
          }
          puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar21 = uVar23 + 0x40;
            if (count <= uVar23 + 0x40) {
              uVar21 = count;
            }
LAB_0148f9c0:
            pdVar26 = pdVar19 + uVar23 * 0x10 + 8;
            for (; uVar13 = uVar23, uVar23 < uVar21; uVar23 = uVar23 + 1) {
              input_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar7 + uVar23 * 8);
              input_02.value._0_8_ = *(undefined8 *)(pdVar20 + 8);
              sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar20,input_02,1,in_R9);
              *(long *)(pdVar26 + -8) = sVar29.value._0_8_;
              *(long *)pdVar26 = sVar29.value._8_8_;
              pdVar26 = pdVar26 + 0x10;
            }
          }
          else {
            uVar24 = puVar4[uVar14];
            uVar21 = uVar23 + 0x40;
            if (count <= uVar23 + 0x40) {
              uVar21 = count;
            }
            if (uVar24 == 0xffffffffffffffff) goto LAB_0148f9c0;
            uVar13 = uVar21;
            if (uVar24 != 0) {
              pdVar26 = pdVar19 + uVar23 * 0x10 + 8;
              for (uVar22 = 0; uVar13 = uVar23 + uVar22, uVar23 + uVar22 < uVar21;
                  uVar22 = uVar22 + 1) {
                if ((uVar24 >> (uVar22 & 0x3f) & 1) != 0) {
                  input_03.value.pointer.ptr =
                       (char *)*(undefined8 *)(pdVar7 + uVar22 * 8 + uVar23 * 8);
                  input_03.value._0_8_ = *(undefined8 *)(pdVar20 + 8);
                  sVar29 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar20,input_03,1,in_R9);
                  *(long *)(pdVar26 + -8) = sVar29.value._0_8_;
                  *(long *)pdVar26 = sVar29.value._8_8_;
                }
                pdVar26 = pdVar26 + 0x10;
              }
            }
          }
          uVar14 = uVar14 + 1;
          uVar23 = uVar13;
        } while( true );
      }
    }
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
LAB_0148f7e8:
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ListExtractFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto count = args.size();

	Vector &base = args.data[0];
	Vector &subscript = args.data[1];

	switch (base.GetType().id()) {
	case LogicalTypeId::LIST:
		ExecuteListExtract(result, base, subscript, count);
		break;
	case LogicalTypeId::VARCHAR:
		ExecuteStringExtract(result, base, subscript, count);
		break;
	case LogicalTypeId::SQLNULL:
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented");
	}
}